

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util_test.cc
# Opt level: O2

Test * StringPieceUtilTestSplitStringPiece::Create(void)

{
  g_current_test = (Test *)operator_new(0x10);
  g_current_test->failed_ = false;
  g_current_test->assertion_failures_ = 0;
  g_current_test->_vptr_Test = (_func_int **)&PTR__Test_001c2260;
  return g_current_test;
}

Assistant:

TEST(StringPieceUtilTest, SplitStringPiece) {
  {
    string input("a:b:c");
    vector<StringPiece> list = SplitStringPiece(input, ':');

    EXPECT_EQ(list.size(), 3);

    EXPECT_EQ(list[0], "a");
    EXPECT_EQ(list[1], "b");
    EXPECT_EQ(list[2], "c");
  }

  {
    string empty("");
    vector<StringPiece> list = SplitStringPiece(empty, ':');

    EXPECT_EQ(list.size(), 1);

    EXPECT_EQ(list[0], "");
  }

  {
    string one("a");
    vector<StringPiece> list = SplitStringPiece(one, ':');

    EXPECT_EQ(list.size(), 1);

    EXPECT_EQ(list[0], "a");
  }

  {
    string sep_only(":");
    vector<StringPiece> list = SplitStringPiece(sep_only, ':');

    EXPECT_EQ(list.size(), 2);

    EXPECT_EQ(list[0], "");
    EXPECT_EQ(list[1], "");
  }

  {
    string sep(":a:b:c:");
    vector<StringPiece> list = SplitStringPiece(sep, ':');

    EXPECT_EQ(list.size(), 5);

    EXPECT_EQ(list[0], "");
    EXPECT_EQ(list[1], "a");
    EXPECT_EQ(list[2], "b");
    EXPECT_EQ(list[3], "c");
    EXPECT_EQ(list[4], "");
  }
}